

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_begin_sb(telnet_t *telnet,uchar telopt)

{
  uchar sb [3];
  char local_2b [3];
  telnet_event_t local_28;
  
  local_28.data.buffer = local_2b;
  local_2b[0] = -1;
  local_2b[1] = -6;
  local_28.type = TELNET_EV_SEND;
  local_28.data.size = 3;
  local_2b[2] = telopt;
  (*telnet->eh)(telnet,&local_28,telnet->ud);
  return;
}

Assistant:

void telnet_begin_sb(telnet_t *telnet, unsigned char telopt) {
	unsigned char sb[3];
	sb[0] = TELNET_IAC;
	sb[1] = TELNET_SB;
	sb[2] = telopt;
	_sendu(telnet, sb, 3);
}